

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.hh
# Opt level: O1

void __thiscall avro::Name::~Name(Name *this)

{
  if (*(Name **)(this + 0x20) != this + 0x30) {
    operator_delete(*(Name **)(this + 0x20),*(long *)(this + 0x30) + 1);
  }
  if (*(Name **)this != this + 0x10) {
    operator_delete(*(Name **)this,*(long *)(this + 0x10) + 1);
    return;
  }
  return;
}

Assistant:

class AVRO_DECL Name {
    std::string ns_;
    std::string simpleName_;
public:
    Name() { }
    Name(const std::string& fullname);
    Name(const std::string& simpleName, const std::string& ns) : ns_(ns), simpleName_(simpleName) { check(); }

    const std::string fullname() const;
    const std::string& ns() const { return ns_; }
    const std::string& simpleName() const { return simpleName_; }

    void ns(const std::string& n) { ns_ = n; }
    void simpleName(const std::string& n) { simpleName_ = n; }
    void fullname(const std::string& n);

    bool operator < (const Name& n) const;
    void check() const;
    bool operator == (const Name& n) const;
    bool operator != (const Name& n) const { return !((*this) == n); }
    void clear() {
        ns_.clear();
        simpleName_.clear();
    }
    operator std::string() const {
        return fullname();
    }
}